

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall helics::CommonCore::processCommand(CommonCore *this,ActionMessage *command)

{
  BrokerBase *this_00;
  action_t aVar1;
  int iVar2;
  pointer pcVar3;
  size_type sVar4;
  long lVar5;
  GlobalHandle fed_id;
  pointer ppVar6;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  bool bVar7;
  FederateStates FVar8;
  __type_conflict _Var9;
  mapped_type *this_01;
  BasicHandleInfo *this_02;
  FederateState *pFVar10;
  string *psVar11;
  string *psVar12;
  string *psVar13;
  FedInfo **ppFVar14;
  ActionMessage *in_RDX;
  GlobalFederateId GVar15;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  pointer __lhs;
  string_view tag;
  string_view federateName;
  string_view message_03;
  string_view name;
  string_view string1;
  string_view federateName_00;
  string_view name_00;
  string_view value;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  ActionMessage pngrep;
  bool local_140;
  string local_138;
  ActionMessage local_118;
  const_iterator local_60;
  const_iterator local_48;
  
  this_00 = &this->super_BrokerBase;
  if (0x17 < (this->super_BrokerBase).maxLogLevel.super___atomic_base<int>._M_i) {
    GVar15.gid = (this->super_BrokerBase).global_broker_id_local.gid;
    pcVar3 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
    sVar4 = (this->super_BrokerBase).identifier._M_string_length;
    prettyPrintString_abi_cxx11_(&local_138,(helics *)command,in_RDX);
    pngrep._0_8_ = local_138._M_dataplus._M_p;
    pngrep.source_id.gid = (undefined4)local_138._M_string_length;
    pngrep.source_handle.hid = local_138._M_string_length._4_4_;
    pngrep.dest_id.gid = (command->source_id).gid;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&pngrep;
    fmt.size_ = 0x1d;
    fmt.data_ = (char *)0x11;
    ::fmt::v11::vformat_abi_cxx11_((string *)&local_118,(v11 *)"|| cmd:{} from {}",fmt,args);
    in_R9.values_ = (value<fmt::v11::context> *)0x0;
    message._M_str = (char *)local_118._0_8_;
    message._M_len._0_4_ = local_118.source_id.gid;
    message._M_len._4_4_ = local_118.source_handle.hid;
    name_00._M_str = pcVar3;
    name_00._M_len = sVar4;
    BrokerBase::sendToLogger(this_00,GVar15,0x18,name_00,message,false);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
  }
  aVar1 = command->messageAction;
  switch(aVar1) {
  case cmd_add_named_input:
  case cmd_add_named_filter:
  case cmd_add_named_publication:
  case cmd_add_named_endpoint:
    checkForNamedInterface(this,command);
    return;
  case cmd_add_named_input|cmd_disconnect_name:
  case cmd_add_named_input|cmd_disconnect_check:
  case cmd_add_named_input|cmd_disconnect_fed:
  case cmd_add_named_input|cmd_broadcast_disconnect:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x73:
  case 0x74:
  case 0x75:
  case 0x76:
  case 0x77:
  case 0x78:
  case 0x79:
  case 0x7a:
  case 0x7b:
  case 0x80:
  case 0x81:
  case 0x82:
  case 0x83:
  case 0x84:
  case cmd_remove_publication|cmd_user_disconnect:
  case cmd_remove_publication|cmd_disconnect:
  case cmd_add_dependency|cmd_user_disconnect:
  case cmd_add_dependency|cmd_disconnect:
  case cmd_add_dependent|cmd_user_disconnect:
  case cmd_add_dependent|cmd_disconnect:
    goto switchD_00250e2f_caseD_10000020;
  case cmd_remove_named_input:
  case cmd_remove_named_filter:
  case cmd_remove_named_publication:
  case cmd_remove_named_endpoint:
    removeNamedTarget(this,command);
    return;
  case cmd_close_interface:
    disconnectInterface(this,command);
    return;
  case cmd_remove_subscriber:
  case cmd_remove_filter:
  case cmd_remove_publication:
  case cmd_remove_endpoint:
    removeTargetFromInterface(this,command);
    return;
  case cmd_add_dependency:
  case cmd_remove_dependency:
  case cmd_add_dependent:
  case cmd_remove_dependent:
  case cmd_add_interdependency:
  case cmd_remove_interdependency:
    goto switchD_00250deb_caseD_34;
  default:
    switch(aVar1) {
    case cmd_ignore:
      return;
    case cmd_tick:
      processTimingTick(this,command);
      return;
    case cmd_user_disconnect:
    case cmd_disconnect:
    case cmd_disconnect_check:
    case cmd_disconnect_fed:
    case cmd_broadcast_disconnect:
    case cmd_stop:
switchD_00250dcb_caseD_2:
      processDisconnectCommand(this,command);
      return;
    case cmd_disconnect_name:
    case cmd_disconnect_core:
    case cmd_disconnect_broker:
    case cmd_init_not_ready:
    case cmd_init_not_ready|cmd_tick:
    case cmd_init_not_ready|cmd_user_disconnect:
    case cmd_init_not_ready|cmd_disconnect:
    case ~(cmd_add_route|cmd_init_not_ready|cmd_disconnect):
    case ~(cmd_add_route|cmd_init_not_ready|cmd_user_disconnect):
    case ~(cmd_add_route|cmd_init_not_ready|cmd_tick):
    case ~(cmd_add_route|cmd_init_not_ready):
    case cmd_exec_request|cmd_tick:
    case cmd_exec_grant|cmd_tick:
    case cmd_exec_check:
    case cmd_exec_check|cmd_tick:
    case cmd_exec_check|cmd_user_disconnect:
    case cmd_exec_check|cmd_disconnect:
    case cmd_exec_check|cmd_disconnect_name:
    case cmd_exec_check|cmd_disconnect_check:
      goto switchD_00250e2f_caseD_10000020;
    case cmd_init:
    case cmd_init_grant:
      processInitRequest(this,command);
      return;
    case cmd_exec_grant:
      if ((command->source_id).gid == (this->keyFed).gid) {
        LOCK();
        (this->simTime).super___atomic_float<double>._M_fp = 0.0;
        UNLOCK();
      }
    case cmd_exec_request:
      processExecRequest(this,command);
      return;
    case cmd_broker_setup:
switchD_00250dcb_caseD_ffffffff:
      if ((command->dest_id).gid != (this->super_BrokerBase).global_broker_id_local.gid) {
        return;
      }
      ActionMessage::ActionMessage(&pngrep,cmd_ping_reply);
      pngrep.dest_id.gid = (command->source_id).gid;
      pngrep.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
      routeMessage(this,&pngrep);
LAB_002515bf:
      ActionMessage::~ActionMessage(&pngrep);
      return;
    }
  }
  switch(aVar1) {
  case cmd_time_grant:
    if ((command->source_id).gid == (this->keyFed).gid) {
      lVar5 = (command->actionTime).internalTimeCode;
      LOCK();
      (this->simTime).super___atomic_float<double>._M_fp =
           (double)(lVar5 % 1000000000) * 1e-09 + (double)(lVar5 / 1000000000);
      UNLOCK();
    }
LAB_0025105b:
    bVar7 = isLocal(this,(GlobalFederateId)(command->source_id).gid);
    if (bVar7) {
      GVar15.gid = (command->source_id).gid;
      bVar7 = hasTimeBlock(this,GVar15);
      if (bVar7) {
        pngrep.messageAction = GVar15.gid;
        this_01 = std::
                  map<int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
                  ::operator[](&this->delayedTimingMessages,&pngrep.messageAction);
        std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
                  (this_01,command);
        return;
      }
    }
    break;
  case cmd_request_current_time:
    bVar7 = isLocal(this,(GlobalFederateId)(command->dest_id).gid);
    if (bVar7) {
      pFVar10 = getFederateCore(this,(GlobalFederateId)(command->dest_id).gid);
      if (pFVar10 == (FederateState *)0x0) {
        return;
      }
      FVar8 = FederateState::getState(pFVar10);
      if ((FVar8 != FINISHED) && (FVar8 = FederateState::getState(pFVar10), FVar8 != ERRORED)) {
        FederateState::forceProcessMessage(pFVar10,command);
        return;
      }
      FederateState::processPostTerminationAction
                ((optional<helics::ActionMessage> *)&pngrep,pFVar10,command);
      if (local_140 == true) {
        routeMessage(this,&pngrep);
      }
      std::_Optional_payload_base<helics::ActionMessage>::_M_reset
                ((_Optional_payload_base<helics::ActionMessage> *)&pngrep);
      return;
    }
    break;
  case cmd_time_block:
  case cmd_time_unblock:
    manageTimeBlocks(this,command);
    return;
  case cmd_time_barrier:
  case cmd_time_barrier_clear:
    broadcastToFederates(this,command);
    return;
  case cmd_add_publisher:
switchD_00250deb_caseD_32:
    addTargetToInterface(this,command);
    return;
  case cmd_pub:
    break;
  case cmd_log:
switchD_00250deb_caseD_37:
    processLogAndErrorCommand(this,command);
    return;
  default:
    if (((uint)(aVar1 + 0xefffffce) < 0x2e) &&
       ((0x210040100401U >> ((ulong)(uint)(aVar1 + 0xefffffce) & 0x3f) & 1) != 0)) {
      registerInterface(this,command);
      return;
    }
    switch(aVar1) {
    case cmd_send_for_filter:
    case cmd_send_for_dest_filter_return:
    case cmd_send_for_filter_return:
      if ((command->dest_id).gid != (this->filterFedID)._M_i.gid) {
        return;
      }
      FilterFederate::processMessageFilter(this->filterFed,command);
      return;
    case ~(cmd_reg_broker|cmd_broadcast_disconnect):
    case ~(cmd_reg_broker|cmd_disconnect_fed):
    case ~(cmd_reg_broker|cmd_disconnect_check):
    case ~cmd_query:
    case ~cmd_query_reply:
    case ~(cmd_reg_broker|cmd_tick):
    case ~cmd_reg_broker:
      break;
    case cmd_filter_result:
switchD_00250e2f_caseD_10000028:
      FilterFederate::processFilterReturn(this->filterFed,command);
      return;
    case cmd_dest_filter_result:
switchD_00250e2f_caseD_10000029:
      FilterFederate::processDestFilterReturn(this->filterFed,command);
      return;
    default:
      if (((uint)(aVar1 + 0xffffd8fa) < 0x10) &&
         ((0xa401U >> (aVar1 + 0xffffd8fa & 0x1fU) & 1) != 0)) goto switchD_00250deb_caseD_37;
      if (((uint)(aVar1 + 0xeffffd3d) < 9) && ((0x115U >> (aVar1 + 0xeffffd3d & 0x1fU) & 1) != 0)) {
        processLinkingCommand(this,command);
        return;
      }
      if (((uint)(aVar1 + 0xfffffc57) < 6) && ((0x25U >> (aVar1 + 0xfffffc57 & 0x1fU) & 1) != 0)) {
        processQueryCommand(this,command);
        return;
      }
      if (((uint)(aVar1 + 0xfffffc16) < 7) && ((0x43U >> (aVar1 + 0xfffffc16 & 0x1fU) & 1) != 0))
      goto switchD_00250dcb_caseD_2;
      if ((aVar1 == cmd_add_filter) ||
         ((aVar1 == cmd_add_subscriber || (aVar1 == cmd_add_endpoint))))
      goto switchD_00250deb_caseD_32;
      if (aVar1 == cmd_send_command_ordered) {
        GVar15.gid = (command->dest_id).gid;
        if (GVar15.gid == (this->super_BrokerBase).global_broker_id_local.gid) {
LAB_00251604:
          processCommandInstruction(this,command);
          return;
        }
        if (GVar15.gid == 0) {
          psVar12 = ActionMessage::getString_abi_cxx11_(command,0);
          bVar7 = std::operator==(psVar12,"core");
          if ((bVar7) ||
             (_Var9 = std::operator==(psVar12,&(this->super_BrokerBase).identifier), _Var9))
          goto LAB_00251604;
          federateName_00._M_str = (psVar12->_M_dataplus)._M_p;
          federateName_00._M_len = psVar12->_M_string_length;
          pFVar10 = getFederateCore(this,federateName_00);
          if (pFVar10 != (FederateState *)0x0) goto LAB_00251642;
          GVar15.gid = (command->dest_id).gid;
        }
        bVar7 = isLocal(this,GVar15);
        if ((!bVar7) ||
           (pFVar10 = getFederateCore(this,(GlobalFederateId)(command->dest_id).gid),
           pFVar10 == (FederateState *)0x0)) {
          routeMessage(this,command);
          return;
        }
LAB_00251642:
        FederateState::sendCommand(pFVar10,command);
        return;
      }
      if (aVar1 == cmd_core_configure) {
        processCoreConfigureCommands(this,command);
        return;
      }
      if (aVar1 == cmd_interface_tag) {
        fed_id.fed_id.gid = (command->source_id).gid;
        fed_id.handle.hid = (command->source_handle).hid;
        this_02 = HandleManager::findHandle(&this->loopHandles,fed_id);
        if (this_02 == (BasicHandleInfo *)0x0) {
          return;
        }
        psVar12 = ActionMessage::getString_abi_cxx11_(command,0);
        pcVar3 = (psVar12->_M_dataplus)._M_p;
        sVar4 = psVar12->_M_string_length;
        psVar12 = ActionMessage::getString_abi_cxx11_(command,1);
        tag._M_str = pcVar3;
        tag._M_len = sVar4;
        value._M_str = (psVar12->_M_dataplus)._M_p;
        value._M_len = psVar12->_M_string_length;
        BasicHandleInfo::setTag(this_02,tag,value);
        return;
      }
      if (aVar1 == cmd_core_tag) {
        iVar2 = (this->super_BrokerBase).global_broker_id_local.gid;
        if ((command->source_id).gid != iVar2) {
          return;
        }
        if ((command->dest_id).gid != iVar2) {
          return;
        }
        psVar12 = ActionMessage::getString_abi_cxx11_(command,0);
        __lhs = (this->tags).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
        ppVar6 = (this->tags).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        do {
          if (__lhs == ppVar6) {
LAB_00251527:
            psVar13 = ActionMessage::getString_abi_cxx11_(command,1);
            std::
            vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
            ::emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                      ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                        *)&this->tags,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar12,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar13)
            ;
            return;
          }
          _Var9 = std::operator==(&__lhs->first,psVar12);
          if (_Var9) {
            psVar13 = ActionMessage::getString_abi_cxx11_(command,1);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_assign(&__lhs->second,psVar13);
            goto LAB_00251527;
          }
          __lhs = __lhs + 1;
        } while( true );
      }
      if (aVar1 == cmd_check_connections) {
        bVar7 = checkAndProcessDisconnect(this);
        gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::
        begin(&local_48,&(this->loopFederates).dataStorage);
        gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::
        end(&local_60,&(this->loopFederates).dataStorage);
        pngrep.dest_id.gid = local_48.offset;
        pngrep.dest_handle.hid = local_48._20_4_;
        pngrep._0_8_ = local_48.vec;
        pngrep._8_8_ = local_48.ptr;
        while( true ) {
          if ((pngrep.dest_id.gid == local_60.offset) &&
             (ppFVar14 = local_60.vec, GVar15.gid = local_60.offset,
             (FedInfo **)pngrep._0_8_ == local_60.vec)) goto LAB_00251454;
          FVar8 = FederateState::getState(*(FederateState **)pngrep._8_8_);
          if ((FVar8 & ~INITIALIZING) != ERRORED) break;
          gmlc::containers::BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>
          ::operator++((BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*> *)
                       &pngrep);
        }
        ppFVar14 = (FedInfo **)pngrep._0_8_;
        GVar15.gid = pngrep.dest_id.gid;
LAB_00251454:
        pngrep.actionTime.internalTimeCode._0_1_ =
             local_60.offset == GVar15.gid && local_60.vec == ppFVar14;
        GVar15.gid = (this->super_BrokerBase).global_broker_id_local.gid;
        pcVar3 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
        sVar4 = (this->super_BrokerBase).identifier._M_string_length;
        pngrep._16_8_ = (this->loopFederates).dataStorage.csize;
        pngrep.messageAction._0_1_ = bVar7;
        args_00.field_1.args_ = in_R9.args_;
        args_00.desc_ = (unsigned_long_long)&pngrep;
        fmt_00.size_ = 0x747;
        fmt_00.data_ = (char *)0x37;
        ::fmt::v11::vformat_abi_cxx11_
                  ((string *)&local_118,
                   (v11 *)"CHECK CONNECTIONS {}, federates={}, fed_disconnected={}",fmt_00,args_00);
        message_02._M_str = (char *)local_118._0_8_;
        message_02._M_len._0_4_ = local_118.source_id.gid;
        message_02._M_len._4_4_ = local_118.source_handle.hid;
        name_03._M_str = pcVar3;
        name_03._M_len = sVar4;
        BrokerBase::sendToLogger(this_00,GVar15,3,name_03,message_02,false);
        std::__cxx11::string::~string((string *)&local_118);
        return;
      }
      if (aVar1 == cmd_ping) goto switchD_00250dcb_caseD_ffffffff;
      if (aVar1 == cmd_ping_reply) {
        if ((command->dest_id).gid != (this->super_BrokerBase).global_broker_id_local.gid) {
          return;
        }
        TimeoutMonitor::pingReply
                  ((this->timeoutMon)._M_t.
                   super___uniq_ptr_impl<helics::TimeoutMonitor,_std::default_delete<helics::TimeoutMonitor>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::TimeoutMonitor_*,_std::default_delete<helics::TimeoutMonitor>_>
                   .super__Head_base<0UL,_helics::TimeoutMonitor_*,_false>._M_head_impl,command,
                   (CoreBroker *)0x0);
        return;
      }
      if ((aVar1 == cmd_timing_info) || (aVar1 == cmd_grant_timeout_check))
      goto switchD_00250deb_caseD_34;
      if (aVar1 == cmd_profiler_data) {
        if ((this->super_BrokerBase).enable_profiling == true) {
          message_03._M_str = (char *)(command->payload).heap;
          message_03._M_len = (command->payload).bufferSize;
          BrokerBase::saveProfilingData(this_00,message_03);
          return;
        }
        routeMessage(this,command,(GlobalFederateId)0x0);
        return;
      }
      if (aVar1 == cmd_set_profiler_flag) goto switchD_00250deb_caseD_34;
      if (aVar1 == cmd_time_request) goto LAB_0025105b;
      if (aVar1 == cmd_null_message) goto switchD_00250e2f_caseD_10000028;
      if (aVar1 == cmd_null_dest_message) goto switchD_00250e2f_caseD_10000029;
      if (aVar1 == cmd_search_dependency) {
        federateName._M_str = (char *)(command->payload).heap;
        federateName._M_len = (command->payload).bufferSize;
        pFVar10 = getFederateCore(this,federateName);
        if (((pFVar10 == (FederateState *)0x0) ||
            (iVar2 = (pFVar10->global_id)._M_i.gid, iVar2 == -2010000000)) || (iVar2 == -1700000000)
           ) {
          (*(this->super_Core)._vptr_Core[0x6b])(this,0,command);
          return;
        }
        ActionMessage::ActionMessage
                  (&pngrep,cmd_add_dependency,(GlobalFederateId)(pFVar10->global_id)._M_i.gid,
                   (GlobalFederateId)(command->source_id).gid);
        routeMessage(this,&pngrep);
        ActionMessage::ActionMessage
                  (&local_118,cmd_add_dependent,(GlobalFederateId)(command->source_id).gid,
                   (GlobalFederateId)(pFVar10->global_id)._M_i.gid);
        ActionMessage::operator=(&pngrep,&local_118);
        ActionMessage::~ActionMessage(&local_118);
        routeMessage(this,&pngrep);
        goto LAB_002515bf;
      }
      if (aVar1 == cmd_remote_log) goto switchD_00250deb_caseD_37;
      if (aVar1 == cmd_resend) {
        message_00._M_str = "got resend";
        message_00._M_len = 10;
        name_01._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
        name_01._M_len = (this->super_BrokerBase).identifier._M_string_length;
        BrokerBase::sendToLogger
                  (this_00,(GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,3,
                   name_01,message_00,false);
        if (command->messageID != -0x10000028) {
          return;
        }
        if ((((this->super_BrokerBase).global_id._M_i.gid != 0) &&
            (iVar2 = (this->super_BrokerBase).global_id._M_i.gid, iVar2 != -1700000000)) &&
           (iVar2 != -2010000000)) {
          return;
        }
        message_01._M_str = "resending broker reg";
        message_01._M_len = 0x14;
        name_02._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
        name_02._M_len = (this->super_BrokerBase).identifier._M_string_length;
        BrokerBase::sendToLogger
                  (this_00,(GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,3,
                   name_02,message_01,false);
        ActionMessage::ActionMessage(&pngrep,cmd_reg_broker);
        pngrep.source_id.gid = -2010000000;
        name._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
        name._M_len = (this->super_BrokerBase).identifier._M_string_length;
        ActionMessage::name(&pngrep,name);
        psVar11 = getAddress_abi_cxx11_(this);
        string1._M_str = (psVar11->_M_dataplus)._M_p;
        string1._M_len = psVar11->_M_string_length;
        ActionMessage::setStringData(&pngrep,string1);
        pngrep.flags._0_1_ = (byte)pngrep.flags | 8;
        pngrep.counter = 1;
        (*(this->super_Core)._vptr_Core[0x6b])(this,0);
        goto LAB_002515bf;
      }
      if (aVar1 == cmd_send_message) {
        if (((command->flags & 0x80) != 0) ||
           (((command->dest_id).gid == 0 &&
            (bVar7 = isLocal(this,(GlobalFederateId)(command->source_id).gid), bVar7)))) {
          command = processMessage(this,command);
        }
        deliverMessage(this,command);
        return;
      }
    }
  case cmd_time_check:
  case cmd_time_check|cmd_tick:
  case cmd_request_current_time|cmd_tick:
  case cmd_time_barrier_request:
  case cmd_time_barrier_clear|cmd_tick:
  case cmd_time_barrier_clear|cmd_user_disconnect:
  case cmd_time_barrier_clear|cmd_disconnect:
  case 0x30:
  case 0x31:
  case cmd_add_publisher|cmd_tick:
  case cmd_pub|cmd_tick:
  case cmd_pub|cmd_user_disconnect:
switchD_00250e2f_caseD_10000020:
    if (aVar1 < cmd_ignore) {
      processPriorityCommand(this,command);
      return;
    }
    bVar7 = isLocal(this,(GlobalFederateId)(command->dest_id).gid);
    if (!bVar7) {
      return;
    }
  }
switchD_00250deb_caseD_34:
  routeMessage(this,command);
  return;
}

Assistant:

void CommonCore::processCommand(ActionMessage&& command)
{
    LOG_TRACE(global_broker_id_local,
              getIdentifier(),
              fmt::format("|| cmd:{} from {}",
                          prettyPrintString(command),
                          command.source_id.baseValue()));
    switch (command.action()) {
        case CMD_IGNORE:
            break;
        case CMD_TICK:
            processTimingTick(command);
            break;
        case CMD_PING:
        case CMD_BROKER_PING:  // broker ping for core is the same as core
            if (command.dest_id == global_broker_id_local) {
                ActionMessage pngrep(CMD_PING_REPLY);
                pngrep.dest_id = command.source_id;
                pngrep.source_id = global_broker_id_local;
                routeMessage(pngrep);
            }
            break;
        case CMD_PING_REPLY:
            if (command.dest_id == global_broker_id_local) {
                timeoutMon->pingReply(command);
            }
            break;
        case CMD_RESEND:
            LOG_WARNING_SIMPLE("got resend");
            if (command.messageID == static_cast<int32_t>(CMD_REG_BROKER)) {
                if ((global_id.load() == parent_broker_id) || (!(global_id.load().isValid()))) {
                    LOG_WARNING_SIMPLE("resending broker reg");
                    ActionMessage reg(CMD_REG_BROKER);
                    reg.source_id = GlobalFederateId{};
                    reg.name(getIdentifier());
                    reg.setStringData(getAddress());
                    setActionFlag(reg, core_flag);
                    reg.counter = 1;
                    transmit(parent_route_id, reg);
                }
            }
            break;
        case CMD_TIME_BARRIER:
        case CMD_TIME_BARRIER_CLEAR:
            broadcastToFederates(command);
            break;
        case CMD_CHECK_CONNECTIONS: {
            auto res = checkAndProcessDisconnect();
            auto pred = [](const auto& fed) {
                auto state = fed->getState();
                return (FederateStates::FINISHED == state) || (FederateStates::ERRORED == state);
            };
            auto afed = std::all_of(loopFederates.begin(), loopFederates.end(), pred);
            LOG_WARNING(global_broker_id_local,
                        getIdentifier(),
                        fmt::format("CHECK CONNECTIONS {}, federates={}, fed_disconnected={}",
                                    res,
                                    loopFederates.size(),
                                    afed));
        }

        break;
        case CMD_USER_DISCONNECT:
        case CMD_GLOBAL_DISCONNECT:
        case CMD_BROADCAST_DISCONNECT:
        case CMD_STOP:
        case CMD_DISCONNECT:
        case CMD_DISCONNECT_FED:
        case CMD_DISCONNECT_CHECK:
        case CMD_DISCONNECT_CORE_ACK:
        case CMD_TIMEOUT_DISCONNECT:
            processDisconnectCommand(command);
            break;
        case CMD_EXEC_GRANT:
            if (command.source_id == keyFed) {
                simTime.store(0.0);
            }
            [[fallthrough]];
        case CMD_EXEC_REQUEST:
            processExecRequest(command);
            break;
        case CMD_TIME_GRANT:
            if (command.source_id == keyFed) {
                simTime.store(static_cast<double>(command.actionTime));
            }
            [[fallthrough]];
        case CMD_TIME_REQUEST:
            if (isLocal(command.source_id)) {
                if (hasTimeBlock(command.source_id)) {
                    delayedTimingMessages[command.source_id.baseValue()].push_back(command);
                    break;
                }
            }
            routeMessage(command);
            break;
        case CMD_GRANT_TIMEOUT_CHECK:
            routeMessage(command);
            break;
        case CMD_TIME_BLOCK:
        case CMD_TIME_UNBLOCK:
            manageTimeBlocks(command);
            break;
        case CMD_BROKER_QUERY_ORDERED:
        case CMD_QUERY_ORDERED:
        case CMD_QUERY_REPLY_ORDERED:
            processQueryCommand(command);
            break;
        case CMD_SEND_COMMAND_ORDERED:
            if (command.dest_id == global_broker_id_local) {
                processCommandInstruction(command);
                break;
            }
            if (command.dest_id == parent_broker_id) {
                const auto& target = command.getString(targetStringLoc);
                if (target == "core" || target == getIdentifier()) {
                    processCommandInstruction(command);
                    break;
                }
                auto* fed = getFederateCore(target);
                if (fed != nullptr) {
                    fed->sendCommand(command);
                    break;
                }
            }
            if (isLocal(command.dest_id)) {
                auto* fed = getFederateCore(command.dest_id);
                if (fed != nullptr) {
                    fed->sendCommand(command);
                    break;
                }
            }
            routeMessage(std::move(command));
            break;
        case CMD_SEARCH_DEPENDENCY: {
            auto* fed = getFederateCore(command.name());
            if (fed != nullptr) {
                if (fed->global_id.load().isValid()) {
                    ActionMessage dep(CMD_ADD_DEPENDENCY, fed->global_id.load(), command.source_id);
                    routeMessage(dep);
                    dep =
                        ActionMessage(CMD_ADD_DEPENDENT, command.source_id, fed->global_id.load());
                    routeMessage(dep);
                    break;
                }
            }
            // it is not found send to broker
            transmit(parent_route_id, command);
        } break;
        case CMD_ADD_DEPENDENCY:
        case CMD_REMOVE_DEPENDENCY:
        case CMD_ADD_DEPENDENT:
        case CMD_REMOVE_DEPENDENT:
        case CMD_ADD_INTERDEPENDENCY:
        case CMD_REMOVE_INTERDEPENDENCY:
        case CMD_TIMING_INFO:
            routeMessage(command);
            break;
        case CMD_SEND_FOR_FILTER:
        case CMD_SEND_FOR_FILTER_AND_RETURN:
        case CMD_SEND_FOR_DEST_FILTER_AND_RETURN:
            if (command.dest_id == filterFedID.load()) {
                filterFed->processMessageFilter(command);
            }
            break;
        case CMD_NULL_MESSAGE:
        case CMD_FILTER_RESULT:
            // if (command.dest_id == filterFedID.load()) {
            filterFed->processFilterReturn(command);
            //  }
            break;
        case CMD_DEST_FILTER_RESULT:
        case CMD_NULL_DEST_MESSAGE:
            //  if (command.dest_id == filterFedID) {
            filterFed->processDestFilterReturn(command);
            //  }
            break;
        case CMD_PUB:
            routeMessage(command);
            break;
        case CMD_LOG:
        case CMD_REMOTE_LOG:
        case CMD_WARNING:
        case CMD_ERROR:
        case CMD_LOCAL_ERROR:
        case CMD_GLOBAL_ERROR:
            processLogAndErrorCommand(command);
            break;
        case CMD_DATA_LINK:
        case CMD_ENDPOINT_LINK:
        case CMD_FILTER_LINK:
        case CMD_ADD_ALIAS:
            processLinkingCommand(command);
            break;
        case CMD_REG_INPUT:
        case CMD_REG_ENDPOINT:
        case CMD_REG_DATASINK:
        case CMD_REG_PUB:
        case CMD_REG_FILTER:
        case CMD_REG_TRANSLATOR:
            registerInterface(command);
            break;
        case CMD_ADD_NAMED_ENDPOINT:
        case CMD_ADD_NAMED_PUBLICATION:
        case CMD_ADD_NAMED_INPUT:
        case CMD_ADD_NAMED_FILTER:
            checkForNamedInterface(command);
            break;
        case CMD_ADD_ENDPOINT:
        case CMD_ADD_FILTER:
        case CMD_ADD_SUBSCRIBER:
        case CMD_ADD_PUBLISHER:
            addTargetToInterface(command);
            break;
        case CMD_REMOVE_NAMED_ENDPOINT:
        case CMD_REMOVE_NAMED_PUBLICATION:
        case CMD_REMOVE_NAMED_INPUT:
        case CMD_REMOVE_NAMED_FILTER:
            removeNamedTarget(command);
            break;
        case CMD_REMOVE_PUBLICATION:
        case CMD_REMOVE_SUBSCRIBER:
        case CMD_REMOVE_FILTER:
        case CMD_REMOVE_ENDPOINT:
            removeTargetFromInterface(command);
            break;
        case CMD_CLOSE_INTERFACE:
            disconnectInterface(command);
            break;
        case CMD_CORE_TAG:
            if (command.source_id == global_broker_id_local &&
                command.dest_id == global_broker_id_local) {
                const auto& keyTag = command.getString(0);
                for (auto& tag : tags) {
                    if (tag.first == keyTag) {
                        tag.second = command.getString(1);
                        break;
                    }
                }
                tags.emplace_back(keyTag, command.getString(1));
            }
            break;
        case CMD_CORE_CONFIGURE:
            processCoreConfigureCommands(command);
            break;
        case CMD_INTERFACE_TAG: {
            auto* handle = loopHandles.findHandle(command.getSource());
            if (handle != nullptr) {
                handle->setTag(command.getString(0), command.getString(1));
            }
            break;
        }
        case CMD_INIT:
        case CMD_INIT_GRANT:
            processInitRequest(command);
            break;
        case CMD_SEND_MESSAGE:
            if (checkActionFlag(command, filter_processing_required_flag) ||
                ((command.dest_id == parent_broker_id) && (isLocal(command.source_id)))) {
                deliverMessage(processMessage(command));
            } else {
                deliverMessage(command);
            }

            break;
        case CMD_PROFILER_DATA:
            if (enable_profiling) {
                saveProfilingData(command.payload.to_string());
            } else {
                routeMessage(std::move(command), parent_broker_id);
            }
            break;
        case CMD_SET_PROFILER_FLAG:
            routeMessage(command);
            break;
        case CMD_REQUEST_CURRENT_TIME:
            if (isLocal(command.dest_id)) {
                auto* fed = getFederateCore(command.dest_id);
                if (fed != nullptr) {
                    if ((fed->getState() != FederateStates::FINISHED) &&
                        (fed->getState() != FederateStates::ERRORED)) {
                        fed->forceProcessMessage(command);
                    } else {
                        auto rep = fed->processPostTerminationAction(command);
                        if (rep) {
                            routeMessage(*rep);
                        }
                    }
                }
            } else {
                routeMessage(command);
            }
            break;
        default:
            if (isPriorityCommand(command)) {
                // this is a backup if somehow one of these message got here
                processPriorityCommand(std::move(command));
            } else if (isLocal(command.dest_id)) {
                routeMessage(command);
            }
            break;
    }
}